

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_reflection_class.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::ReflectionClassGenerator::WriteIntroduction
          (ReflectionClassGenerator *this,Printer *printer)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string local_40;
  
  text._M_str = 
  "// <auto-generated>\n//     Generated by the protocol buffer compiler.  DO NOT EDIT!\n//     source: $file_name$\n// </auto-generated>\n#pragma warning disable 1591, 0612, 3021, 8981\n#region Designer generated code\n\nusing pb = global::Google.Protobuf;\nusing pbc = global::Google.Protobuf.Collections;\nusing pbr = global::Google.Protobuf.Reflection;\nusing scg = global::System.Collections.Generic;\n"
  ;
  text._M_len = 0x189;
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,text,(char (*) [10])"file_name",
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              (this->file_ + 8));
  if ((this->namespace_)._M_string_length != 0) {
    text_00._M_str = "namespace $namespace$ {\n";
    text_00._M_len = 0x18;
    io::Printer::Print<char[10],std::__cxx11::string>
              (printer,text_00,(char (*) [10])0x37ce53,&this->namespace_);
    *(long *)(printer + 0x68) = *(long *)(printer + 0x68) + *(long *)(printer + 0x58);
    text_01._M_str = "\n";
    text_01._M_len = 1;
    io::Printer::Print<>(printer,text_01);
  }
  args_1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(this->file_ + 8);
  SourceGeneratorBase::class_access_level_abi_cxx11_(&local_40,&this->super_SourceGeneratorBase);
  text_02._M_str =
       "/// <summary>Holder for reflection information generated from $file_name$</summary>\n$access_level$ static partial class $reflection_class_name$ {\n\n"
  ;
  text_02._M_len = 0x93;
  io::Printer::
  Print<char[10],std::__cxx11::string,char[13],std::__cxx11::string,char[22],std::__cxx11::string>
            (printer,text_02,(char (*) [10])"file_name",args_1,(char (*) [13])"access_level",
             &local_40,(char (*) [22])0x380d9d,&this->reflectionClassname_);
  std::__cxx11::string::~string((string *)&local_40);
  *(long *)(printer + 0x68) = *(long *)(printer + 0x68) + *(long *)(printer + 0x58);
  return;
}

Assistant:

void ReflectionClassGenerator::WriteIntroduction(io::Printer* printer) {
  printer->Print(
    "// <auto-generated>\n"
    "//     Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
    "//     source: $file_name$\n"
    "// </auto-generated>\n"
    "#pragma warning disable 1591, 0612, 3021, 8981\n"
    "#region Designer generated code\n"
    "\n"
    "using pb = global::Google.Protobuf;\n"
    "using pbc = global::Google.Protobuf.Collections;\n"
    "using pbr = global::Google.Protobuf.Reflection;\n"
    "using scg = global::System.Collections.Generic;\n",
    "file_name", file_->name());

  if (!namespace_.empty()) {
    printer->Print("namespace $namespace$ {\n", "namespace", namespace_);
    printer->Indent();
    printer->Print("\n");
  }

  printer->Print(
    "/// <summary>Holder for reflection information generated from $file_name$</summary>\n"
    "$access_level$ static partial class $reflection_class_name$ {\n"
    "\n",
    "file_name", file_->name(),
    "access_level", class_access_level(),
    "reflection_class_name", reflectionClassname_);
  printer->Indent();
}